

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_12b475::DistortionState::update
          (DistortionState *this,ALCcontext *context,EffectSlot *slot,EffectProps *props,
          EffectTarget target)

{
  span<float,_16UL> *this_00;
  float *in_RCX;
  long in_RSI;
  float (*in_RDI) [3];
  element_type_conflict2 (*in_R8) [16];
  float fVar1;
  undefined4 extraout_XMM0_Db;
  double dVar2;
  array<float,_16UL> coeffs;
  float frequency;
  float bandwidth;
  float cutoff;
  float edge;
  ALCdevice *device;
  float spread;
  undefined8 in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff58;
  BiquadType in_stack_ffffffffffffff5c;
  BiquadFilterR<float> *in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff7c;
  float *in_stack_ffffffffffffff80;
  MixParams *in_stack_ffffffffffffff88;
  span<float,_16UL> in_stack_ffffffffffffff90;
  
  al::intrusive_ptr<ALCdevice>::get((intrusive_ptr<ALCdevice> *)(in_RSI + 0x200));
  fVar1 = al::MathDefs<float>::Pi();
  spread = 0.5;
  dVar2 = std::sin((double)CONCAT44(extraout_XMM0_Db,fVar1 * 0.5 * *in_RCX));
  fVar1 = minf(SUB84(dVar2,0),0.99);
  in_RDI[0xd][0] = (fVar1 + fVar1) / (1.0 - fVar1);
  BiquadFilterR<float>::setParamsFromBandwidth
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
             (float)((ulong)in_stack_ffffffffffffff50 >> 0x20),(float)in_stack_ffffffffffffff50);
  BiquadFilterR<float>::setParamsFromBandwidth
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
             (float)((ulong)in_stack_ffffffffffffff50 >> 0x20),(float)in_stack_ffffffffffffff50);
  CalcDirectionCoeffs(in_RDI,spread);
  *(undefined8 *)(in_RDI[1] + 1) = *(undefined8 *)in_R8[2];
  *(undefined8 *)in_RDI[2] = *(undefined8 *)(in_R8[2] + 2);
  this_00 = (span<float,_16UL> *)std::array<float,_16UL>::data((array<float,_16UL> *)0x1d5f39);
  al::span<float,_16UL>::span(this_00,in_R8);
  ComputePanGains(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                  in_stack_ffffffffffffff90);
  return;
}

Assistant:

void DistortionState::update(const ALCcontext *context, const EffectSlot *slot,
    const EffectProps *props, const EffectTarget target)
{
    const ALCdevice *device{context->mDevice.get()};

    /* Store waveshaper edge settings. */
    const float edge{minf(std::sin(al::MathDefs<float>::Pi()*0.5f * props->Distortion.Edge),
        0.99f)};
    mEdgeCoeff = 2.0f * edge / (1.0f-edge);

    float cutoff{props->Distortion.LowpassCutoff};
    /* Bandwidth value is constant in octaves. */
    float bandwidth{(cutoff / 2.0f) / (cutoff * 0.67f)};
    /* Divide normalized frequency by the amount of oversampling done during
     * processing.
     */
    auto frequency = static_cast<float>(device->Frequency);
    mLowpass.setParamsFromBandwidth(BiquadType::LowPass, cutoff/frequency/4.0f, 1.0f, bandwidth);

    cutoff = props->Distortion.EQCenter;
    /* Convert bandwidth in Hz to octaves. */
    bandwidth = props->Distortion.EQBandwidth / (cutoff * 0.67f);
    mBandpass.setParamsFromBandwidth(BiquadType::BandPass, cutoff/frequency/4.0f, 1.0f, bandwidth);

    const auto coeffs = CalcDirectionCoeffs({0.0f, 0.0f, -1.0f}, 0.0f);

    mOutTarget = target.Main->Buffer;
    ComputePanGains(target.Main, coeffs.data(), slot->Gain*props->Distortion.Gain, mGain);
}